

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.hpp
# Opt level: O3

uint lcp_bitwise<unsigned_long>(unsigned_long x,unsigned_long y,uint k,uint bits_per_char)

{
  ulong uVar1;
  
  if (x != y) {
    uVar1 = (y ^ x) >> 1 | y ^ x;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    uVar1 = uVar1 >> 0x10 | uVar1;
    uVar1 = uVar1 >> 0x20 | uVar1;
    k = (~*(uint *)(log2_64(unsigned_long)::tab64 +
                   ((uVar1 - (uVar1 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a) * 4) + k * bits_per_char) /
        bits_per_char;
  }
  return k;
}

Assistant:

unsigned int lcp_bitwise(T x, T y, unsigned int k, unsigned int bits_per_char) {
    if (x == y)
        return k;
    // XOR the two values and then find the MSB that isn't zero (since
    // the k-mer strings start (have first character) at MSB)
    T z = x ^ y;
    // get leading zeros (TODO: in bitops implement faster version for 32bit)
    unsigned int lz = leading_zeros(z);

    // get leading zeros in the k-mer representation
    unsigned int kmer_leading_zeros = lz - (sizeof(T)*8 - k*bits_per_char);
    unsigned int lcp = kmer_leading_zeros / bits_per_char;
    return lcp;
}